

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

uint * RDL_giveRCF(RDL_data *data,uint index,char mode)

{
  uint rcf_internal_index;
  uint bcc_index;
  RDL_graph *pRVar1;
  char *edges;
  void *__ptr;
  uint *puVar2;
  RDL_node *pRVar3;
  int iVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar4 = (int)CONCAT71(in_register_00000011,mode);
  if (iVar4 == 0x62) {
    uVar6 = data->rcf_to_urf[index][0];
    rcf_internal_index = data->rcf_to_urf[index][1];
    bcc_index = data->urf_to_bcc[uVar6][0];
    uVar6 = data->urf_to_bcc[uVar6][1];
    pRVar1 = data->bccGraphs->bcc_graphs[bcc_index];
    edges = (char *)calloc(1,(ulong)pRVar1->E);
    __ptr = malloc(0x100);
    RDL_getEdges_internal(data,bcc_index,uVar6,rcf_internal_index,edges);
    uVar5 = 0x40;
    uVar6 = 0;
    for (uVar8 = 0; uVar7 = (ulong)uVar6, uVar8 < pRVar1->E; uVar8 = uVar8 + 1) {
      if (edges[uVar8] == '\x01') {
        if (uVar6 == (uint)uVar5) {
          uVar5 = (ulong)((uint)uVar5 * 2);
          __ptr = realloc(__ptr,uVar5 * 4);
        }
        uVar6 = uVar6 + 1;
        *(uint *)((long)__ptr + uVar7 * 4) =
             data->bccGraphs->edge_from_bcc_mapping[bcc_index][uVar8];
      }
    }
    puVar2 = (uint *)realloc(__ptr,(ulong)(uVar6 + 1) << 2);
    puVar2[uVar7] = 0xffffffff;
    free(edges);
    return puVar2;
  }
  if (iVar4 == 0x61) {
    pRVar3 = RDL_getNodesRCF(data,index);
    return pRVar3;
  }
  (*RDL_outputFunc)(RDL_ERROR,"tried to call \'RDL_giveRCF()\' with invalid mode \'%c\'\n",
                    (ulong)(uint)(int)mode);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RingDecomposerLib.c"
                ,0x2c9,"unsigned int *RDL_giveRCF(const RDL_data *, unsigned int, char)");
}

Assistant:

static unsigned *RDL_giveRCF(const RDL_data *data, unsigned index, char mode)
{
  unsigned *result;
  if(mode == 'a')
  {
    result = RDL_getNodesRCF(data, index);
  }
  else if(mode == 'b')
  {
    result = RDL_getEdgesRCF(data, index);
  }
  else
  {
    RDL_outputFunc(RDL_ERROR, "tried to call 'RDL_giveRCF()' with invalid mode '%c'\n", mode);
    /* cannot occur when using interface */
    assert(0);
    return NULL;
  }

  return result;
}